

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# IF97.h
# Opt level: O1

double __thiscall IF97::Region3::lambda1(Region3 *this,double T,double rho)

{
  uint uVar1;
  pointer piVar2;
  bool bVar3;
  uint uVar4;
  long lVar5;
  long lVar6;
  double dVar7;
  double dVar8;
  double dVar9;
  double dVar10;
  double dVar11;
  double dVar12;
  
  piVar2 = (this->lamJr).super__Vector_base<int,_std::allocator<int>_>._M_impl.
           super__Vector_impl_data._M_start;
  lVar5 = (long)(this->lamJr).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                super__Vector_impl_data._M_finish - (long)piVar2;
  if (lVar5 == 0) {
    dVar7 = exp(0.0);
    return dVar7;
  }
  lVar5 = lVar5 >> 2;
  dVar8 = 647.096 / T + -1.0;
  dVar9 = rho / 322.0 + -1.0;
  dVar7 = 0.0;
  lVar6 = 0;
  do {
    uVar1 = (this->lamIr).super__Vector_base<int,_std::allocator<int>_>._M_impl.
            super__Vector_impl_data._M_start[lVar6];
    dVar10 = 1.0;
    if (uVar1 != 0) {
      uVar4 = -uVar1;
      if (0 < (int)uVar1) {
        uVar4 = uVar1;
      }
      dVar11 = 1.0 / dVar8;
      if (-1 < (int)uVar1) {
        dVar11 = dVar8;
      }
      dVar10 = 1.0;
      do {
        if ((uVar4 & 1) != 0) {
          dVar10 = dVar10 * dVar11;
        }
        dVar11 = dVar11 * dVar11;
        bVar3 = 1 < uVar4;
        uVar4 = uVar4 >> 1;
      } while (bVar3);
    }
    uVar1 = piVar2[lVar6];
    dVar11 = 1.0;
    if (uVar1 != 0) {
      uVar4 = -uVar1;
      if (0 < (int)uVar1) {
        uVar4 = uVar1;
      }
      dVar12 = 1.0 / dVar9;
      if (-1 < (int)uVar1) {
        dVar12 = dVar9;
      }
      dVar11 = 1.0;
      do {
        if ((uVar4 & 1) != 0) {
          dVar11 = dVar11 * dVar12;
        }
        dVar12 = dVar12 * dVar12;
        bVar3 = 1 < uVar4;
        uVar4 = uVar4 >> 1;
      } while (bVar3);
    }
    dVar7 = dVar7 + dVar10 * (rho / 322.0) *
                    (this->lamnr).super__Vector_base<double,_std::allocator<double>_>._M_impl.
                    super__Vector_impl_data._M_start[lVar6] * dVar11;
    lVar6 = lVar6 + 1;
  } while (lVar6 != lVar5 + (ulong)(lVar5 == 0));
  dVar7 = exp(dVar7);
  return dVar7;
}

Assistant:

double lambda1(double T, double rho) const{
            const double rho_bar = rho/Rhocrit;
            double summer = 0.0;
            for (std::size_t i = 0; i < lamJr.size(); ++i){
                summer += rho_bar * powi(Trterm(T),lamIr[i]) * lamnr[i]*powi(Rhorterm(rho),lamJr[i]);
            }
            return exp(summer);
        }